

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O1

int arkode_butcher_order6n
              (sunrealtype *b,sunrealtype **A1,sunrealtype *c1,sunrealtype **A2,sunrealtype *c2,
              sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *x;
  sunrealtype *b_00;
  ulong uVar2;
  ulong uVar3;
  size_t __nmemb;
  double dVar4;
  
  __nmemb = (size_t)s;
  x = (sunrealtype *)calloc(__nmemb,8);
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  if (((c3 != (sunrealtype *)0x0 && c2 != (sunrealtype *)0x0) && 0 < (long)__nmemb) &&
      x != (sunrealtype *)0x0) {
    uVar3 = (ulong)(uint)s;
    uVar2 = 0;
    do {
      x[uVar2] = c2[uVar2] * c3[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
    if ((((c3 != (sunrealtype *)0x0 && c2 != (sunrealtype *)0x0) && 0 < (long)__nmemb) &&
         x != (sunrealtype *)0x0) && (iVar1 = arkode_butcher_mv(A2,x,s,b_00), iVar1 == 0)) {
      if ((x != (sunrealtype *)0x0 && 0 < s) &&
          (b_00 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) {
        uVar2 = 0;
        do {
          x[uVar2] = c1[uVar2] * b_00[uVar2];
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
        if (((x != (sunrealtype *)0x0 && 0 < s) &&
             (b_00 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) &&
           (iVar1 = arkode_butcher_mv(A1,x,s,b_00), iVar1 == 0)) {
          if ((b != (sunrealtype *)0x0 && b_00 != (sunrealtype *)0x0) && 0 < s) {
            dVar4 = 0.0;
            uVar2 = 0;
            do {
              dVar4 = dVar4 + b[uVar2] * b_00[uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar3 != uVar2);
            dVar4 = dVar4 + -0.011111111111111112;
          }
          else {
            dVar4 = NAN;
          }
          if ((b == (sunrealtype *)0x0 || b_00 == (sunrealtype *)0x0) || 0 >= s) {
            return 0;
          }
          free(x);
          free(b_00);
          return (uint)(ABS(dVar4) <= 1.4901161193847656e-08);
        }
      }
    }
  }
  free(x);
  free(b_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6n(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype* c1, sunrealtype** A2,
                                             sunrealtype* c2, sunrealtype* c3,
                                             int s)
{
  sunrealtype bAcAcc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAcAcc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAcAcc - SUN_RCONST(1.0) / SUN_RCONST(90.0)) > TOL) ? SUNFALSE
                                                                      : SUNTRUE;
}